

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<TPZEqnArray<long_double>_> * __thiscall
TPZVec<TPZEqnArray<long_double>_>::operator=
          (TPZVec<TPZEqnArray<long_double>_> *this,TPZVec<TPZEqnArray<long_double>_> *rval)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  TPZEqnArray<long_double> *pTVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  long lVar7;
  TPZEqnArray<long_double> *pTVar8;
  long lVar9;
  ulong uVar10;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    pTVar8 = this->fStore;
    if (pTVar8 != (TPZEqnArray<long_double> *)0x0) {
      lVar9 = *(long *)&pTVar8[-1].field_0x51d8;
      if (lVar9 != 0) {
        lVar7 = lVar9 * 0x51e0;
        do {
          TPZEqnArray<long_double>::~TPZEqnArray
                    ((TPZEqnArray<long_double> *)
                     ((long)pTVar8[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x28));
          lVar7 = lVar7 + -0x51e0;
        } while (lVar7 != 0);
      }
      operator_delete__(&pTVar8[-1].fLastTerm,lVar9 * 0x51e0 | 0x10);
    }
    if (rval->fNAlloc == 0) {
      uVar3 = this->fNElements;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar3;
      uVar10 = 0xffffffffffffffff;
      if (SUB168(auVar5 * ZEXT816(0x51e0),8) == 0) {
        uVar10 = SUB168(auVar5 * ZEXT816(0x51e0),0) | 0x10;
      }
      pvVar6 = operator_new__(uVar10);
      *(ulong *)((long)pvVar6 + 8) = uVar3;
      if (uVar3 != 0) {
        lVar9 = 0;
        pTVar8 = (TPZEqnArray<long_double> *)((long)pvVar6 + 0x10);
        do {
          TPZEqnArray<long_double>::TPZEqnArray(pTVar8);
          lVar9 = lVar9 + -0x51e0;
          pTVar8 = pTVar8 + 1;
        } while (uVar3 * -0x51e0 - lVar9 != 0);
      }
      this->fStore = (TPZEqnArray<long_double> *)((long)pvVar6 + 0x10);
      if (0 < this->fNElements) {
        lVar7 = 0;
        lVar9 = 0;
        do {
          pTVar8 = rval->fStore;
          pTVar4 = this->fStore;
          puVar1 = (undefined8 *)
                   ((long)(pTVar8->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar7 + -0x28)
          ;
          puVar2 = (undefined8 *)
                   ((long)(pTVar4->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar7 + -0x28)
          ;
          *puVar2 = *puVar1;
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1));
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)
                     ((long)(pTVar4->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x20),
                     (TPZManVector<int,_100> *)
                     ((long)(pTVar8->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x20));
          TPZManVector<long_double,_1000>::operator=
                    ((TPZManVector<long_double,_1000> *)
                     ((long)(pTVar4->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                     lVar7 + -0x20),
                     (TPZManVector<long_double,_1000> *)
                     ((long)(pTVar8->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                     lVar7 + -0x20));
          TPZManVector<int,_1000>::operator=
                    ((TPZManVector<int,_1000> *)
                     ((long)(pTVar4->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar7 + -0x20
                     ),(TPZManVector<int,_1000> *)
                       ((long)(pTVar8->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar7 + -0x20));
          *(undefined4 *)(puVar2 + 0xa3a) = *(undefined4 *)(puVar1 + 0xa3a);
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 0x51e0;
        } while (lVar9 < this->fNElements);
      }
    }
    else {
      this->fStore = rval->fStore;
    }
    this->fNAlloc = this->fNElements;
    rval->fStore = (TPZEqnArray<long_double> *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}